

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O2

void __thiscall
TPZEqnArray<double>::EqnBackward(TPZEqnArray<double> *this,TPZFMatrix<double> *U,DecomposeType dec)

{
  ulong uVar1;
  double dVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  double local_40;
  
  if (this->fSymmetric == EIsNonSymmetric) {
    uVar5 = (ulong)(uint)this->fNumEq;
    while (1 < (int)uVar5) {
      uVar1 = uVar5 - 2;
      piVar4 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore;
      lVar8 = (long)piVar4[uVar5 - 2];
      iVar3 = piVar4[uVar5 - 1];
      local_40 = 0.0;
      lVar7 = lVar8;
      while( true ) {
        lVar7 = lVar7 + 1;
        piVar4 = (this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore;
        if (iVar3 <= lVar7) break;
        pdVar6 = TPZFMatrix<double>::operator()(U,(long)piVar4[lVar7],0);
        local_40 = local_40 -
                   *pdVar6 * (this->fEqValues).super_TPZManVector<double,_1000>.super_TPZVec<double>
                             .fStore[lVar7];
      }
      pdVar6 = TPZFMatrix<double>::operator()(U,(long)piVar4[lVar8],0);
      *pdVar6 = local_40 + *pdVar6;
      uVar5 = uVar1;
      if ((dec & ~ELUPivot) == ELU) {
        dVar2 = (this->fEqValues).super_TPZManVector<double,_1000>.super_TPZVec<double>.fStore
                [lVar8];
        pdVar6 = TPZFMatrix<double>::operator()
                           (U,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                    fStore[lVar8],0);
        *pdVar6 = *pdVar6 / dVar2;
      }
    }
  }
  else if (this->fSymmetric == EIsSymmetric) {
    uVar5 = (ulong)(uint)this->fNumEq;
    while (0 < (int)uVar5) {
      uVar1 = uVar5 - 1;
      piVar4 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore;
      lVar8 = (long)piVar4[uVar5 - 1];
      iVar3 = piVar4[uVar5];
      local_40 = 0.0;
      lVar7 = lVar8;
      while( true ) {
        lVar7 = lVar7 + 1;
        piVar4 = (this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore;
        if (iVar3 <= lVar7) break;
        pdVar6 = TPZFMatrix<double>::operator()(U,(long)piVar4[lVar7],0);
        local_40 = local_40 -
                   *pdVar6 * (this->fEqValues).super_TPZManVector<double,_1000>.super_TPZVec<double>
                             .fStore[lVar7];
      }
      pdVar6 = TPZFMatrix<double>::operator()(U,(long)piVar4[lVar8],0);
      *pdVar6 = local_40 + *pdVar6;
      uVar5 = uVar1;
      if (dec == ECholesky) {
        dVar2 = (this->fEqValues).super_TPZManVector<double,_1000>.super_TPZVec<double>.fStore
                [lVar8];
        pdVar6 = TPZFMatrix<double>::operator()
                           (U,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                    fStore[lVar8],0);
        *pdVar6 = *pdVar6 / dVar2;
      }
    }
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::EqnBackward(TPZFMatrix<TVar> & U, DecomposeType dec) {
	int n;
	if(IsSymmetric()==EIsSymmetric){
    	for(n=fNumEq-1; n>=0; n--) {
    		int index = fEqStart[n]; 
    		int last_term = fEqStart[n + 1];
    		TVar acum = 0.;
    		int i;
    		for(i = index + 1; i < last_term; i++) acum -= U(fIndex[i],0) * fEqValues[i];
			
            /** Case LU - LDLT - Cholesky*/
            U(fIndex[index],0) += acum;
			
            /** Case Cholesky */
            if(dec == ECholesky){
               	U(fIndex[index],0) /= fEqValues[index];
    		}
    	}
	}else if(IsSymmetric()==EIsNonSymmetric){
        for(n=fNumEq-2; n>=0; n-=2) {
            int index = fEqStart[n];
            int last_term = fEqStart[n + 1];
            TVar acum = 0.;
            int i;
            for(i = index + 1; i < last_term; i++) acum -= U(fIndex[i],0) * fEqValues[i];
			
            /** Case LU - LDLT - Cholesky*/
            U(fIndex[index],0) += acum;
			
            /** Case Cholesky */
            if(dec == ECholesky || dec == ELU){
                U(fIndex[index],0) /= fEqValues[index];
            }
        }
    }
}